

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O0

void __thiscall cfd::core::SigHashType::SigHashType(SigHashType *this)

{
  SigHashType *this_local;
  
  this->kSigHashForkId = '@';
  this->kSigHashRangeproof = '@';
  this->kSigHashAnyOneCanPay = 0x80;
  this->hash_algorithm_ = kSigHashAll;
  this->is_anyone_can_pay_ = false;
  this->is_fork_id_ = false;
  return;
}

Assistant:

SigHashType::SigHashType()
    : hash_algorithm_(SigHashAlgorithm::kSigHashAll),
      is_anyone_can_pay_(false),
      is_fork_id_(false) {
  // nothing
}